

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest01SignatureVerification_::
Section1InvalidDSASignatureTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section1InvalidDSASignatureTest6
          (Section1InvalidDSASignatureTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest01SignatureVerification,
                     Section1InvalidDSASignatureTest6) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "DSACACert",
                               "InvalidDSASignatureTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "DSACACRL"};
  PkitsTestInfo info;
  info.test_number = "4.1.6";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}